

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O2

void brotli::ZopfliIterate
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               size_t max_backward_limit,ZopfliCostModel *model,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *num_matches,
               vector<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_> *matches,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  unsigned_long uVar4;
  BackwardMatch BVar5;
  bool bVar6;
  undefined8 uVar7;
  pointer pZVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  size_t sVar12;
  double *pdVar13;
  undefined8 *puVar14;
  int *piVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  size_t insert_length;
  size_t pos;
  size_t j;
  size_t sVar24;
  long lVar25;
  size_type __n;
  ulong uVar26;
  double dVar27;
  double dVar28;
  size_t inslen;
  vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_> nodes;
  vector<unsigned_int,_std::allocator<unsigned_int>_> backwards;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  StartPosQueue queue;
  Command cmd;
  
  __n = num_bytes + 1;
  std::vector<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::vector
            (&nodes,__n,(allocator_type *)&queue);
  (nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
   super__Vector_impl_data._M_start)->length = 0;
  (nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
   super__Vector_impl_data._M_start)->cost = 0.0;
  uVar7 = *(undefined8 *)(dist_cache + 2);
  *(undefined8 *)
   (nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
    super__Vector_impl_data._M_start)->distance_cache = *(undefined8 *)dist_cache;
  *(undefined8 *)
   ((nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>._M_impl.
     super__Vector_impl_data._M_start)->distance_cache + 2) = uVar7;
  StartPosQueue::StartPosQueue(&queue,3);
  dVar1 = model->min_cost_cmd_;
  pos = 0;
  lVar17 = 0;
  do {
    if (num_bytes <= pos + 3) {
      backwards.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      backwards.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      backwards.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pdVar13 = &nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                 _M_impl.super__Vector_impl_data._M_start[num_bytes].cost;
      do {
        dVar1 = *pdVar13;
        __n = __n - 1;
        pdVar13 = pdVar13 + -6;
      } while (INFINITY <= dVar1);
      for (; __n != 0; __n = __n - uVar22) {
        uVar22 = nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                 _M_impl.super__Vector_impl_data._M_start[__n].insert_length +
                 nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                 _M_impl.super__Vector_impl_data._M_start[__n].length;
        path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,uVar22);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                  (&backwards,(uint *)&path);
      }
      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar17 = (long)backwards.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)backwards.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      lVar25 = (lVar17 >> 2) + 1;
      while( true ) {
        lVar17 = lVar17 + -4;
        lVar25 = lVar25 + -1;
        if (lVar25 == 0) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (&path,(value_type_conflict *)
                         (lVar17 + (long)backwards.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start));
      }
      lVar25 = 0;
      lVar17 = 0;
      for (uVar19 = 0;
          uVar19 < (ulong)((long)path.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)path.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 2); uVar19 = uVar19 + 1
          ) {
        uVar18 = (ulong)path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_start[uVar19];
        uVar22 = nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar17 + uVar18].length;
        uVar16 = (ulong)nodes.
                        super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar17 + uVar18].insert_length;
        uVar26 = uVar16;
        if (uVar19 == 0) {
          uVar26 = *last_insert_len + uVar16;
          *last_insert_len = 0;
        }
        uVar2 = nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar17 + uVar18].distance;
        uVar3 = nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                _M_impl.super__Vector_impl_data._M_start[lVar17 + uVar18].distance_code;
        Command::Command(&cmd,uVar26,(ulong)uVar22,
                         (ulong)nodes.
                                super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar17 + uVar18].
                                length_code,(ulong)uVar3);
        puVar14 = (undefined8 *)((long)&commands->insert_len_ + lVar25);
        uVar18 = position + lVar17 + uVar16;
        if (max_backward_limit <= uVar18) {
          uVar18 = max_backward_limit;
        }
        puVar14[2] = cmd._16_8_;
        *puVar14 = cmd._0_8_;
        puVar14[1] = cmd.cmd_extra_;
        if ((uVar2 <= uVar18) && (uVar3 != 0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          *dist_cache = uVar2;
        }
        *num_literals = *num_literals + uVar26;
        lVar17 = lVar17 + uVar16 + (ulong)uVar22;
        lVar25 = lVar25 + 0x18;
      }
      *last_insert_len = *last_insert_len + (num_bytes - lVar17);
      *num_commands = *num_commands + lVar25 / 0x18;
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&backwards.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::
      _Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
      ::~_Vector_base(&queue.q_.
                       super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
                     );
      std::_Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>::~_Vector_base
                (&nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>)
      ;
      return;
    }
    uVar19 = position + pos;
    sVar9 = max_backward_limit;
    if (uVar19 < max_backward_limit) {
      sVar9 = uVar19;
    }
    pdVar13 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    StartPosQueue::Push(&queue,pos,
                        nodes.
                        super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                        _M_impl.super__Vector_impl_data._M_start[pos].cost -
                        (pdVar13[pos] - *pdVar13));
    sVar10 = ComputeMinimumCopyLength(&queue,&nodes,model,pos,dVar1);
    uVar26 = 0;
    while (pZVar8 = nodes.
                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                    _M_impl.super__Vector_impl_data._M_start, uVar26 != 5) {
      uVar18 = queue.mask_ + 1;
      if (queue.idx_ <= queue.mask_ + 1) {
        uVar18 = queue.idx_;
      }
      if (uVar18 <= uVar26) break;
      uVar18 = uVar26 + 1;
      uVar4 = queue.q_.
              super__Vector_base<std::pair<unsigned_long,_double>,_std::allocator<std::pair<unsigned_long,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar18 - queue.idx_ & queue.mask_].first;
      piVar15 = nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4].distance_cache;
      pdVar13 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      dVar28 = nodes.super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar4].cost - (pdVar13[uVar4] - *pdVar13);
      insert_length = pos - uVar4;
      uVar16 = sVar10 - 1;
      for (sVar24 = 0; sVar24 != 0x10; sVar24 = sVar24 + 1) {
        uVar20 = (long)(int)(&kDistanceCacheOffset)[sVar24] +
                 (long)piVar15[(uint)(&kDistanceCacheIndex)[sVar24]];
        if (((uVar20 <= sVar9) && (uVar19 - uVar20 < uVar19)) &&
           (uVar11 = (uVar19 & ringbuffer_mask) + uVar16, uVar11 <= ringbuffer_mask)) {
          uVar23 = uVar19 - uVar20 & ringbuffer_mask;
          uVar21 = uVar23 + uVar16;
          if ((uVar21 <= ringbuffer_mask) && (ringbuffer[uVar11] == ringbuffer[uVar21])) {
            sVar12 = FindMatchLengthWithLimit
                               (ringbuffer + uVar23,ringbuffer + (uVar19 & ringbuffer_mask),
                                num_bytes - pos);
            lVar25 = uVar16 * 0x30 + pos * 0x30 + 0x58;
            while (uVar11 = uVar16 + 1, uVar11 <= sVar12) {
              dVar27 = ZopfliCostModel::GetCommandCost(model,sVar24,uVar11,insert_length);
              pdVar13 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              dVar27 = (pdVar13[pos] - *pdVar13) + dVar27 + dVar28;
              if (dVar27 < *(double *)
                            ((long)(nodes.
                                    super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                            lVar25 + -0xc)) {
                *(int *)((long)(nodes.
                                super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                        lVar25 + -0x34) = (int)uVar11;
                *(int *)((long)(nodes.
                                super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                        lVar25 + -0x18) = (int)uVar11;
                *(int *)((long)(nodes.
                                super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                        lVar25 + -0x30) = (int)uVar20;
                *(int *)((long)(nodes.
                                super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                        lVar25 + -0x2c) = (int)sVar24;
                *(int *)((long)(nodes.
                                super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                        lVar25 + -0x14) = (int)insert_length;
                *(double *)
                 ((long)(nodes.
                         super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                         ._M_impl.super__Vector_impl_data._M_start)->distance_cache + lVar25 + -0xc)
                     = dVar27;
                if (sVar24 == 0) {
                  uVar7 = *(undefined8 *)(pZVar8[uVar4].distance_cache + 2);
                  *(undefined8 *)
                   ((long)(nodes.
                           super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                   lVar25 + -0x28) = *(undefined8 *)piVar15;
                  *(undefined8 *)
                   ((long)(nodes.
                           super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                   lVar25 + -0x20) = uVar7;
                }
                else {
                  *(int *)((long)(nodes.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar25 + -0x28) = (int)uVar20;
                  *(undefined8 *)
                   ((long)(nodes.
                           super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                           ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                   lVar25 + -0x24) = *(undefined8 *)piVar15;
                  *(int *)((long)(nodes.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar25 + -0x1c) = pZVar8[uVar4].distance_cache[2];
                }
              }
              lVar25 = lVar25 + 0x30;
              uVar16 = uVar11;
            }
          }
        }
      }
      bVar6 = uVar26 < 2;
      uVar26 = uVar18;
      if (bVar6) {
        sVar24 = sVar10;
        for (uVar18 = 0;
            uVar18 < (num_matches->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[pos]; uVar18 = uVar18 + 1) {
          BVar5 = (matches->
                  super__Vector_base<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>)
                  ._M_impl.super__Vector_impl_data._M_start[lVar17 + uVar18];
          uVar20 = (ulong)BVar5 & 0xffffffff;
          uVar11 = (ulong)BVar5 >> 0x25;
          uVar16 = uVar11;
          if (uVar11 < sVar24) {
            uVar16 = sVar24;
          }
          if (sVar9 < uVar20) {
            sVar24 = uVar16;
          }
          if (0xa2 < BVar5.length_and_code >> 6) {
            sVar24 = uVar16;
          }
          uVar16 = (ulong)(BVar5.length_and_code & 0x1f);
          if (((ulong)BVar5 & 0x1f00000000) == 0) {
            uVar16 = uVar11;
          }
          lVar25 = sVar24 * 0x30 + pos * 0x30 + 0x28;
          for (; sVar24 <= uVar11; sVar24 = sVar24 + 1) {
            uVar21 = sVar24;
            if (sVar9 < uVar20) {
              uVar21 = uVar16;
            }
            dVar27 = ZopfliCostModel::GetCommandCost(model,uVar20 + 0xf,uVar21,insert_length);
            pdVar13 = (model->literal_costs_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            dVar27 = (pdVar13[pos] - *pdVar13) + dVar27 + dVar28;
            if (dVar27 < *(double *)
                          ((long)(nodes.
                                  super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                          lVar25 + -0xc)) {
              *(int *)((long)(nodes.
                              super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                              ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                      lVar25 + -0x34) = (int)sVar24;
              *(int *)((long)(nodes.
                              super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                              ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                      lVar25 + -0x18) = (int)uVar21;
              *(uint32_t *)
               ((long)(nodes.
                       super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                       _M_impl.super__Vector_impl_data._M_start)->distance_cache + lVar25 + -0x30) =
                   BVar5.distance;
              *(int *)((long)(nodes.
                              super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                              ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                      lVar25 + -0x2c) = (int)(uVar20 + 0xf);
              *(int *)((long)(nodes.
                              super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                              ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                      lVar25 + -0x14) = (int)insert_length;
              *(double *)
               ((long)(nodes.
                       super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>.
                       _M_impl.super__Vector_impl_data._M_start)->distance_cache + lVar25 + -0xc) =
                   dVar27;
              if (sVar9 < uVar20) {
                uVar7 = *(undefined8 *)(pZVar8[uVar4].distance_cache + 2);
                *(undefined8 *)
                 ((long)(nodes.
                         super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                         ._M_impl.super__Vector_impl_data._M_start)->distance_cache + lVar25 + -0x28
                 ) = *(undefined8 *)piVar15;
                *(undefined8 *)
                 ((long)(nodes.
                         super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                         ._M_impl.super__Vector_impl_data._M_start)->distance_cache + lVar25 + -0x20
                 ) = uVar7;
              }
              else {
                *(uint32_t *)
                 ((long)(nodes.
                         super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                         ._M_impl.super__Vector_impl_data._M_start)->distance_cache + lVar25 + -0x28
                 ) = BVar5.distance;
                *(undefined8 *)
                 ((long)(nodes.
                         super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                         ._M_impl.super__Vector_impl_data._M_start)->distance_cache + lVar25 + -0x24
                 ) = *(undefined8 *)piVar15;
                *(int *)((long)(nodes.
                                super__Vector_base<brotli::ZopfliNode,_std::allocator<brotli::ZopfliNode>_>
                                ._M_impl.super__Vector_impl_data._M_start)->distance_cache +
                        lVar25 + -0x1c) = pZVar8[uVar4].distance_cache[2];
              }
            }
            lVar25 = lVar25 + 0x30;
          }
        }
      }
    }
    uVar19 = (ulong)(num_matches->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start[pos];
    lVar17 = lVar17 + uVar19;
    if ((uVar19 == 1) &&
       (uVar22 = (matches->
                 super__Vector_base<brotli::BackwardMatch,_std::allocator<brotli::BackwardMatch>_>).
                 _M_impl.super__Vector_impl_data._M_start[lVar17 + -1].length_and_code,
       0x28bf < uVar22)) {
      pos = (pos + (uVar22 >> 5)) - 1;
      queue.idx_ = 0;
    }
    pos = pos + 1;
  } while( true );
}

Assistant:

void ZopfliIterate(size_t num_bytes,
                   size_t position,
                   const uint8_t* ringbuffer,
                   size_t ringbuffer_mask,
                   const size_t max_backward_limit,
                   const ZopfliCostModel& model,
                   const std::vector<uint32_t>& num_matches,
                   const std::vector<BackwardMatch>& matches,
                   int* dist_cache,
                   size_t* last_insert_len,
                   Command* commands,
                   size_t* num_commands,
                   size_t* num_literals) {
  const Command * const orig_commands = commands;

  std::vector<ZopfliNode> nodes(num_bytes + 1);
  nodes[0].length = 0;
  nodes[0].cost = 0;
  memcpy(nodes[0].distance_cache, dist_cache, 4 * sizeof(dist_cache[0]));

  StartPosQueue queue(3);
  const double min_cost_cmd = model.GetMinCostCmd();

  size_t cur_match_pos = 0;
  for (size_t i = 0; i + 3 < num_bytes; i++) {
    size_t cur_ix = position + i;
    size_t cur_ix_masked = cur_ix & ringbuffer_mask;
    size_t max_distance = std::min(cur_ix, max_backward_limit);
    size_t max_length = num_bytes - i;

    queue.Push(i, nodes[i].cost - model.GetLiteralCosts(0, i));

    const size_t min_len = ComputeMinimumCopyLength(queue, nodes, model,
                                                    i, min_cost_cmd);

    // Go over the command starting positions in order of increasing cost
    // difference.
    for (size_t k = 0; k < 5 && k < queue.size(); ++k) {
      const size_t start = queue.GetStartPos(k);
      const double start_costdiff =
          nodes[start].cost - model.GetLiteralCosts(0, start);
      const int* dist_cache2 = &nodes[start].distance_cache[0];

      // Look for last distance matches using the distance cache from this
      // starting position.
      size_t best_len = min_len - 1;
      for (size_t j = 0; j < kNumDistanceShortCodes; ++j) {
        const size_t idx = kDistanceCacheIndex[j];
        const size_t backward =
            static_cast<size_t>(dist_cache2[idx] + kDistanceCacheOffset[j]);
        size_t prev_ix = cur_ix - backward;
        if (prev_ix >= cur_ix) {
          continue;
        }
        if (PREDICT_FALSE(backward > max_distance)) {
          continue;
        }
        prev_ix &= ringbuffer_mask;

        if (cur_ix_masked + best_len > ringbuffer_mask ||
            prev_ix + best_len > ringbuffer_mask ||
            ringbuffer[cur_ix_masked + best_len] !=
            ringbuffer[prev_ix + best_len]) {
          continue;
        }
        const size_t len =
            FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                     &ringbuffer[cur_ix_masked],
                                     max_length);
        for (size_t l = best_len + 1; l <= len; ++l) {
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(j, l, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + l].cost) {
            UpdateZopfliNode(&nodes[0], i, start, l, l, backward, j,
                             max_distance, dist_cache2, cost);
          }
          best_len = l;
        }
      }

      // At higher iterations look only for new last distance matches, since
      // looking only for new command start positions with the same distances
      // does not help much.
      if (k >= 2) continue;

      // Loop through all possible copy lengths at this position.
      size_t len = min_len;
      for (size_t j = 0; j < num_matches[i]; ++j) {
        BackwardMatch match = matches[cur_match_pos + j];
        size_t dist = match.distance;
        bool is_dictionary_match = dist > max_distance;
        // We already tried all possible last distance matches, so we can use
        // normal distance code here.
        size_t dist_code = dist + 15;
        // Try all copy lengths up until the maximum copy length corresponding
        // to this distance. If the distance refers to the static dictionary, or
        // the maximum length is long enough, try only one maximum length.
        size_t max_len = match.length();
        if (len < max_len && (is_dictionary_match || max_len > kMaxZopfliLen)) {
          len = max_len;
        }
        for (; len <= max_len; ++len) {
          size_t len_code = is_dictionary_match ? match.length_code() : len;
          const size_t inslen = i - start;
          double cmd_cost = model.GetCommandCost(dist_code, len_code, inslen);
          double cost = start_costdiff + cmd_cost + model.GetLiteralCosts(0, i);
          if (cost < nodes[i + len].cost) {
            UpdateZopfliNode(&nodes[0], i, start, len, len_code, dist,
                             dist_code, max_distance, dist_cache2, cost);
          }
        }
      }
    }

    cur_match_pos += num_matches[i];

    // The zopflification can be too slow in case of very long lengths, so in
    // such case skip it all, it does not cost a lot of compression ratio.
    if (num_matches[i] == 1 &&
        matches[cur_match_pos - 1].length() > kMaxZopfliLen) {
      i += matches[cur_match_pos - 1].length() - 1;
      queue.Clear();
    }
  }

  std::vector<uint32_t> backwards;
  size_t index = num_bytes;
  while (nodes[index].cost == kInfinity) --index;
  while (index != 0) {
    size_t len = nodes[index].length + nodes[index].insert_length;
    backwards.push_back(static_cast<uint32_t>(len));
    index -= len;
  }

  std::vector<uint32_t> path;
  for (size_t i = backwards.size(); i > 0; i--) {
    path.push_back(backwards[i - 1]);
  }

  size_t pos = 0;
  for (size_t i = 0; i < path.size(); i++) {
    const ZopfliNode& next = nodes[pos + path[i]];
    size_t copy_length = next.length;
    size_t insert_length = next.insert_length;
    pos += insert_length;
    if (i == 0) {
      insert_length += *last_insert_len;
      *last_insert_len = 0;
    }
    size_t distance = next.distance;
    size_t len_code = next.length_code;
    size_t max_distance = std::min(position + pos, max_backward_limit);
    bool is_dictionary = (distance > max_distance);
    size_t dist_code = next.distance_code;

    Command cmd(insert_length, copy_length, len_code, dist_code);
    *commands++ = cmd;

    if (!is_dictionary && dist_code > 0) {
      dist_cache[3] = dist_cache[2];
      dist_cache[2] = dist_cache[1];
      dist_cache[1] = dist_cache[0];
      dist_cache[0] = static_cast<int>(distance);
    }

    *num_literals += insert_length;
    insert_length = 0;
    pos += copy_length;
  }
  *last_insert_len += num_bytes - pos;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}